

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_analysis.cpp
# Opt level: O2

SENode * __thiscall
spvtools::opt::ScalarEvolutionAnalysis::CreateMultiplyNode
          (ScalarEvolutionAnalysis *this,SENode *operand_1,SENode *operand_2)

{
  long lVar1;
  int iVar2;
  tuple<spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_> this_00;
  SENode *pSVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  pointer *__ptr;
  __uniq_ptr_impl<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_> local_28;
  
  iVar2 = (**operand_1->_vptr_SENode)(operand_1);
  if ((iVar2 == 6) || (iVar2 = (**operand_2->_vptr_SENode)(operand_2), iVar2 == 6)) {
    return this->cached_cant_compute_;
  }
  iVar2 = (**operand_1->_vptr_SENode)(operand_1);
  if ((iVar2 == 0) && (iVar2 = (**operand_2->_vptr_SENode)(operand_2), iVar2 == 0)) {
    iVar2 = (*operand_1->_vptr_SENode[4])(operand_1);
    lVar1 = *(long *)(CONCAT44(extraout_var,iVar2) + 0x30);
    iVar2 = (*operand_2->_vptr_SENode[4])(operand_2);
    pSVar3 = CreateConstant(this,lVar1 * *(long *)(CONCAT44(extraout_var_00,iVar2) + 0x30));
    return pSVar3;
  }
  this_00.
  super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>.
  super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>)
       ::operator_new(0x30);
  *(pointer *)
   ((long)this_00.
          super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>
          .super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl + 0x18) = (pointer)0x0
  ;
  (((ChildContainerType *)
   ((long)this_00.
          super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>
          .super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl + 8))->
  super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)this_00.
          super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>
          .super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl + 0x10) = (pointer)0x0
  ;
  *(ScalarEvolutionAnalysis **)
   ((long)this_00.
          super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>
          .super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl + 0x20) = this;
  SENode::NumberOfNodes = SENode::NumberOfNodes + 1;
  *(uint32_t *)
   ((long)this_00.
          super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>
          .super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl + 0x28) =
       SENode::NumberOfNodes;
  *(undefined ***)
   this_00.
   super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>.
   super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl = &PTR_GetType_008b0d90;
  SENode::AddChild((SENode *)
                   this_00.
                   super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>
                   .super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl,operand_1);
  (**(code **)(*(long *)this_00.
                        super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>
                        .super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl + 0x18))
            (this_00.
             super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>
             .super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl,operand_2);
  local_28._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>.
  super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl =
       (tuple<spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>)
       (tuple<spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>)
       this_00.
       super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>.
       super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl;
  pSVar3 = GetCachedOrAdd(this,(unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>
                                *)&local_28);
  if ((_Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>)
      local_28._M_t.
      super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>.
      super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl == (SENode *)0x0) {
    return pSVar3;
  }
  (**(code **)(*(long *)local_28._M_t.
                        super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>
                        .super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl + 0x10))
            ();
  return pSVar3;
}

Assistant:

SENode* ScalarEvolutionAnalysis::CreateMultiplyNode(SENode* operand_1,
                                                    SENode* operand_2) {
  // If operands are can't compute then the whole graph is can't compute.
  if (operand_1->IsCantCompute() || operand_2->IsCantCompute())
    return CreateCantComputeNode();

  if (operand_1->GetType() == SENode::Constant &&
      operand_2->GetType() == SENode::Constant) {
    return CreateConstant(operand_1->AsSEConstantNode()->FoldToSingleValue() *
                          operand_2->AsSEConstantNode()->FoldToSingleValue());
  }

  std::unique_ptr<SENode> multiply_node{new SEMultiplyNode(this)};

  multiply_node->AddChild(operand_1);
  multiply_node->AddChild(operand_2);

  return GetCachedOrAdd(std::move(multiply_node));
}